

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O2

MPP_RET mpp_opt_deinit(MppOpt opt)

{
  MppOptImpl *impl;
  
  if (opt != (MppOpt)0x0) {
    if (*(long *)((long)opt + 8) != 0) {
      mpp_trie_deinit();
      *(undefined8 *)((long)opt + 8) = 0;
    }
    mpp_osal_free("mpp_opt_deinit",opt);
    return MPP_OK;
  }
  return MPP_NOK;
}

Assistant:

MPP_RET mpp_opt_deinit(MppOpt opt)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl)
        return MPP_NOK;

    if (impl->trie) {
        mpp_trie_deinit(impl->trie);
        impl->trie = NULL;
    }
    MPP_FREE(impl);

    return MPP_OK;
}